

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.hpp
# Opt level: O0

void __thiscall
pstore::file::in_memory::in_memory
          (in_memory *this,shared_ptr<void> *buffer,uint64_t length,uint64_t eof,bool writable)

{
  bool bVar1;
  bool writable_local;
  uint64_t eof_local;
  uint64_t length_local;
  shared_ptr<void> *buffer_local;
  in_memory *this_local;
  
  file_base::file_base(&this->super_file_base);
  (this->super_file_base)._vptr_file_base = (_func_int **)&PTR__in_memory_002f19d0;
  std::static_pointer_cast<unsigned_char,void>((shared_ptr<void> *)&this->buffer_);
  this->length_ = length;
  this->eof_ = eof;
  this->writable_ = writable;
  this->pos_ = 0;
  bVar1 = std::operator!=(buffer,(nullptr_t)0x0);
  if (!bVar1) {
    assert_failed("buffer != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/os/file.hpp"
                  ,0x1ef);
  }
  if (eof <= length) {
    return;
  }
  assert_failed("eof <= length",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/os/file.hpp"
                ,0x1f0);
}

Assistant:

in_memory (std::shared_ptr<void> const & buffer, std::uint64_t const length,
                       std::uint64_t const eof = 0, bool const writable = true) noexcept
                    : buffer_ (std::static_pointer_cast<std::uint8_t> (buffer))
                    , length_ (length)
                    , eof_ (eof)
                    , writable_ (writable) {

                PSTORE_ASSERT (buffer != nullptr);
                PSTORE_ASSERT (eof <= length);
            }